

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

void __thiscall embree::FileName::FileName(FileName *this,string *in)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  string *in_RSI;
  string *in_RDI;
  bool bVar5;
  size_t i;
  ulong local_28;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  for (local_28 = 0; uVar2 = std::__cxx11::string::size(), local_28 < uVar2; local_28 = local_28 + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if ((*pcVar3 == '\\') ||
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI), *pcVar3 == '/')) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar4 = 0x2f;
    }
  }
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    bVar5 = false;
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      bVar5 = *pcVar3 == '/';
    }
    if (!bVar5) break;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)in_RDI);
  }
  return;
}

Assistant:

FileName::FileName (const std::string& in) {
    filename = in;
    for (size_t i=0; i<filename.size(); i++)
      if (filename[i] == '\\' || filename[i] == '/')
        filename[i] = path_sep;
    while (!filename.empty() && filename[filename.size()-1] == path_sep)
      filename.resize(filename.size()-1);
  }